

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CheckerDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDeclarationSyntax,slang::syntax::CheckerDeclarationSyntax_const&>
          (BumpAllocator *this,CheckerDeclarationSyntax *args)

{
  CheckerDeclarationSyntax *this_00;
  
  this_00 = (CheckerDeclarationSyntax *)allocate(this,0xd8,8);
  slang::syntax::CheckerDeclarationSyntax::CheckerDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }